

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Value_Output.cxx
# Opt level: O1

void __thiscall Fl_Value_Output::draw(Fl_Value_Output *this)

{
  byte bVar1;
  uint c;
  int iVar2;
  int iVar3;
  Fl_Color c_00;
  byte bVar4;
  uint x;
  uint h;
  Fl_Boxtype t;
  uint y;
  uint w;
  char buf [128];
  
  bVar1 = (this->super_Fl_Valuator).super_Fl_Widget.box_;
  bVar4 = 3;
  if (bVar1 != 0) {
    bVar4 = bVar1;
  }
  t = (Fl_Boxtype)bVar4;
  iVar3 = (this->super_Fl_Valuator).super_Fl_Widget.x_;
  iVar2 = Fl::box_dx(t);
  x = iVar2 + iVar3;
  iVar3 = (this->super_Fl_Valuator).super_Fl_Widget.y_;
  iVar2 = Fl::box_dy((uint)bVar4);
  y = iVar2 + iVar3;
  iVar3 = (this->super_Fl_Valuator).super_Fl_Widget.w_;
  iVar2 = Fl::box_dw(t);
  w = iVar3 - iVar2;
  iVar3 = (this->super_Fl_Valuator).super_Fl_Widget.h_;
  iVar2 = Fl::box_dh(t);
  h = iVar3 - iVar2;
  c = (this->super_Fl_Valuator).super_Fl_Widget.color_;
  if ((this->super_Fl_Valuator).super_Fl_Widget.damage_ < 2) {
    (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])(fl_graphics_driver,(ulong)c);
    (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[4])
              (fl_graphics_driver,(ulong)x,(ulong)y,(ulong)w,(ulong)h);
  }
  else {
    Fl_Widget::draw_box((Fl_Widget *)this,t,c);
  }
  (*(this->super_Fl_Valuator).super_Fl_Widget._vptr_Fl_Widget[0xb])(this,buf);
  iVar3 = Fl_Widget::active_r((Fl_Widget *)this);
  c_00 = this->textcolor_;
  if (iVar3 == 0) {
    c_00 = fl_inactive(c_00);
  }
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])(fl_graphics_driver,(ulong)c_00);
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x36])
            (fl_graphics_driver,(ulong)*(uint *)&(this->super_Fl_Valuator).field_0xa4,
             (ulong)(uint)this->textsize_);
  fl_draw(buf,x,y,w,h,4,(Fl_Image *)0x0,1);
  return;
}

Assistant:

void Fl_Value_Output::draw() {
  Fl_Boxtype b = box() ? box() : FL_DOWN_BOX;
  int X = x()+Fl::box_dx(b);
  int Y = y()+Fl::box_dy(b);
  int W = w()-Fl::box_dw(b);
  int H = h()-Fl::box_dh(b);
  if (damage()&~FL_DAMAGE_CHILD)
    draw_box(b, color());
  else {
    fl_color(color());
    fl_rectf(X, Y, W, H);
  }
  char buf[128];
  format(buf);
  fl_color(active_r() ? textcolor() : fl_inactive(textcolor()));
  fl_font(textfont(), textsize());
  fl_draw(buf,X,Y,W,H,FL_ALIGN_LEFT);
}